

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O0

void __thiscall duckdb::EvictionQueue::Purge(EvictionQueue *this)

{
  bool bVar1;
  size_t sVar2;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar3;
  long in_RDI;
  idx_t approx_alive_nodes;
  idx_t approx_dead_nodes;
  idx_t max_purges;
  idx_t approx_q_size;
  idx_t purge_size;
  lock_guard<std::mutex> lock;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *in_stack_ffffffffffffff90;
  ulong local_40;
  idx_t in_stack_ffffffffffffffe8;
  lock_guard<std::mutex> in_stack_fffffffffffffff0;
  
  bVar1 = ::std::mutex::try_lock((mutex *)in_stack_ffffffffffffff90);
  if (bVar1) {
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&stack0xfffffffffffffff0,in_RDI + 0x280);
    sVar2 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::size_approx(in_stack_ffffffffffffff90);
    if (0x7fff < sVar2) {
      for (local_40 = sVar2 / 0x2000; local_40 != 0; local_40 = local_40 - 1) {
        PurgeIteration((EvictionQueue *)in_stack_fffffffffffffff0._M_device,
                       in_stack_ffffffffffffffe8);
        pCVar3 = (ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                  *)duckdb_moodycamel::
                    ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                    ::size_approx(in_stack_ffffffffffffff90);
        if (pCVar3 < (ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                      *)0x8000) break;
        in_stack_ffffffffffffff90 =
             (ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
              *)::std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)pCVar3);
        if (pCVar3 < in_stack_ffffffffffffff90) {
          in_stack_ffffffffffffff90 = pCVar3;
        }
        pCVar3 = (ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                  *)(((long)pCVar3 - (long)in_stack_ffffffffffffff90) * 3);
        if (in_stack_ffffffffffffff90 <= pCVar3 &&
            (long)pCVar3 - (long)in_stack_ffffffffffffff90 != 0) break;
      }
    }
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x9d491c);
  }
  return;
}

Assistant:

void EvictionQueue::Purge() {
	// only one thread purges the queue, all other threads early-out
	if (!purge_lock.try_lock()) {
		return;
	}
	lock_guard<mutex> lock {purge_lock, std::adopt_lock};

	// we purge INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER nodes
	idx_t purge_size = INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER;

	// get an estimate of the queue size as-of now
	idx_t approx_q_size = q.size_approx();

	// early-out, if the queue is not big enough to justify purging
	// - we want to keep the LRU characteristic alive
	if (approx_q_size < purge_size * EARLY_OUT_MULTIPLIER) {
		return;
	}

	// There are two types of situations.

	// For most scenarios, purging INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER nodes is enough.
	// Purging more nodes than we insert also counters oscillation for scenarios where most nodes are dead.
	// If we always purge slightly more, we trigger a purge less often, as we purge below the trigger.

	// However, if the pressure on the queue becomes too contested, we need to purge more aggressively,
	// i.e., we actively seek a specific number of dead nodes to purge. We use the total number of existing dead nodes.
	// We detect this situation by observing the queue's ratio between alive vs. dead nodes. If the ratio of alive vs.
	// dead nodes grows faster than we can purge, we keep purging until we hit one of the following conditions.

	// 2.1. We're back at an approximate queue size less than purge_size * EARLY_OUT_MULTIPLIER.
	// 2.2. We're back at a ratio of 1*alive_node:ALIVE_NODE_MULTIPLIER*dead_nodes.
	// 2.3. We've purged the entire queue: max_purges is zero. This is a worst-case scenario,
	// guaranteeing that we always exit the loop.

	idx_t max_purges = approx_q_size / purge_size;
	while (max_purges != 0) {
		PurgeIteration(purge_size);

		// update relevant sizes and potentially early-out
		approx_q_size = q.size_approx();

		// early-out according to (2.1)
		if (approx_q_size < purge_size * EARLY_OUT_MULTIPLIER) {
			break;
		}

		idx_t approx_dead_nodes = total_dead_nodes;
		approx_dead_nodes = approx_dead_nodes > approx_q_size ? approx_q_size : approx_dead_nodes;
		idx_t approx_alive_nodes = approx_q_size - approx_dead_nodes;

		// early-out according to (2.2)
		if (approx_alive_nodes * (ALIVE_NODE_MULTIPLIER - 1) > approx_dead_nodes) {
			break;
		}

		max_purges--;
	}
}